

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserManager.hpp
# Opt level: O0

void __thiscall sjtu::UserManager::add_user(UserManager *this,int argc,string *argv)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  StringHasher *pSVar4;
  void *pvVar5;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  pair<long,_bool> pVar6;
  undefined1 auVar7 [16];
  userType *user_1;
  pair<sjtu::userType_*,_long> ret_1;
  userType *curuser;
  pair<long,_bool> tmp;
  int i_1;
  int upri;
  string current;
  string umail;
  string uname;
  string uspass;
  string usname;
  int i;
  userType *user;
  pair<sjtu::userType_*,_long> ret;
  value_type *in_stack_000003d0;
  BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *in_stack_000003d8;
  size_t *in_stack_fffffffffffffcc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcd0;
  string *in_stack_fffffffffffffcf8;
  allocator *str;
  StringHasher *in_stack_fffffffffffffd00;
  StringHasher *this_00;
  unsigned_long_long *in_stack_fffffffffffffd48;
  unsigned_long_long *key;
  undefined7 in_stack_fffffffffffffd50;
  undefined1 in_stack_fffffffffffffd57;
  undefined1 uVar8;
  allocator local_221;
  string local_220 [32];
  hashType local_200;
  pair<const_unsigned_long_long,_long> local_1f8;
  StringHasher *local_1e8;
  StringHasher *local_1e0;
  undefined8 local_1d8;
  long local_1d0;
  undefined1 local_1c8;
  byte local_1b9;
  string local_1b8 [32];
  hashType local_198;
  long local_190;
  undefined1 local_188;
  long local_180;
  long local_178;
  undefined1 local_170;
  string local_168 [32];
  hashType local_148;
  long local_140;
  byte local_138;
  int local_130;
  int local_12c;
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [55];
  allocator local_71;
  string local_70 [32];
  hashType local_50;
  pair<const_unsigned_long_long,_long> local_48;
  int local_34;
  char *local_30;
  long local_28;
  undefined8 local_20;
  long local_18;
  int local_c;
  
  local_18 = in_RDX;
  local_c = in_ESI;
  bVar1 = BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::empty
                    (*(BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> **)
                      (in_RDI + 8));
  if (bVar1) {
    auVar7 = (**(code **)(**(long **)(in_RDI + 0x10) + 8))();
    local_28 = auVar7._0_8_;
    *(long *)(local_28 + 0x78) = auVar7._8_8_;
    *(undefined4 *)(local_28 + 0x68) = 10;
    local_34 = 0;
    while( true ) {
      local_20 = auVar7._8_8_;
      local_30 = auVar7._0_8_;
      if (local_c <= local_34) break;
      bVar1 = std::operator==(in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8);
      pcVar3 = local_30;
      if (bVar1) {
        pcVar2 = (char *)std::__cxx11::string::c_str();
        strcpy(pcVar3,pcVar2);
      }
      else {
        bVar1 = std::operator==(in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8);
        if (bVar1) {
          pcVar3 = local_30 + 0x15;
          pcVar2 = (char *)std::__cxx11::string::c_str();
          strcpy(pcVar3,pcVar2);
        }
        else {
          bVar1 = std::operator==(in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8);
          if (bVar1) {
            pcVar3 = local_30 + 0x34;
            pcVar2 = (char *)std::__cxx11::string::c_str();
            strcpy(pcVar3,pcVar2);
          }
          else {
            bVar1 = std::operator==(in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8);
            if (bVar1) {
              pcVar3 = local_30 + 0x49;
              pcVar2 = (char *)std::__cxx11::string::c_str();
              strcpy(pcVar3,pcVar2);
            }
          }
        }
      }
      auVar7._8_8_ = local_20;
      auVar7._0_8_ = local_30;
      local_34 = local_34 + 2;
    }
    local_30[0x6c] = '\0';
    local_30[0x6d] = '\0';
    local_30[0x6e] = '\0';
    local_30[0x6f] = '\0';
    (**(code **)(**(long **)(in_RDI + 0x10) + 0x18))(*(long **)(in_RDI + 0x10),local_30 + 0x78);
    pcVar3 = local_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,pcVar3,&local_71);
    local_50 = StringHasher::operator()(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
    std::pair<const_unsigned_long_long,_long>::pair<unsigned_long_long,_long_&,_true>
              (&local_48,&local_50,(long *)(local_30 + 0x78));
    BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::insert
              (in_stack_000003d8,in_stack_000003d0);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    pvVar5 = (void *)std::ostream::operator<<(&std::cout,0);
    std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
  }
  else {
    std::__cxx11::string::string(local_a8);
    std::__cxx11::string::string(local_c8);
    std::__cxx11::string::string(local_e8);
    std::__cxx11::string::string(local_108);
    std::__cxx11::string::string(local_128);
    for (local_130 = 0; local_130 < local_c; local_130 = local_130 + 2) {
      bVar1 = std::operator==(in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8);
      if (bVar1) {
        std::__cxx11::string::operator=
                  (local_a8,(string *)((long)local_130 * 0x20 + 0x20 + local_18));
      }
      else {
        bVar1 = std::operator==(in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8);
        if (bVar1) {
          std::__cxx11::string::operator=
                    (local_c8,(string *)((long)local_130 * 0x20 + 0x20 + local_18));
        }
        else {
          bVar1 = std::operator==(in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8);
          if (bVar1) {
            std::__cxx11::string::operator=
                      (local_e8,(string *)((long)local_130 * 0x20 + 0x20 + local_18));
          }
          else {
            bVar1 = std::operator==(in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8);
            if (bVar1) {
              std::__cxx11::string::operator=
                        (local_108,(string *)((long)local_130 * 0x20 + 0x20 + local_18));
            }
            else {
              bVar1 = std::operator==(in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8);
              if (bVar1) {
                std::__cxx11::string::operator=
                          (local_128,(string *)((long)local_130 * 0x20 + 0x20 + local_18));
              }
              else {
                bVar1 = std::operator==(in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8)
                ;
                if (bVar1) {
                  local_12c = std::__cxx11::stoi(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8
                                                 ,0);
                }
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::string(local_168,local_128);
    local_148 = StringHasher::operator()(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
    pVar6 = BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::find
                      ((BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *)
                       CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50),
                       in_stack_fffffffffffffd48);
    local_178 = pVar6.first;
    local_170 = pVar6.second;
    local_140 = local_178;
    local_138 = local_170;
    std::__cxx11::string::~string(local_168);
    if ((local_138 & 1) == 0) {
      pvVar5 = (void *)std::ostream::operator<<(&std::cout,-1);
      std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
    }
    else {
      local_180 = (**(code **)(**(long **)(in_RDI + 0x10) + 0x10))
                            (*(long **)(in_RDI + 0x10),&local_140);
      local_1b9 = 0;
      uVar8 = false;
      if ((*(int *)(local_180 + 0x6c) == *(int *)(in_RDI + 0x18)) &&
         (uVar8 = false, local_12c < *(int *)(local_180 + 0x68))) {
        key = *(unsigned_long_long **)(in_RDI + 8);
        std::__cxx11::string::string(local_1b8,local_a8);
        local_1b9 = 1;
        local_198 = StringHasher::operator()(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
        pVar6 = BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::find
                          ((BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>
                            *)CONCAT17(uVar8,in_stack_fffffffffffffd50),key);
        local_1d0 = pVar6.first;
        local_1c8 = pVar6.second;
        uVar8 = ((undefined1  [16])pVar6 & (undefined1  [16])0x1) == (undefined1  [16])0x0;
        local_190 = local_1d0;
        local_188 = local_1c8;
      }
      if ((local_1b9 & 1) != 0) {
        std::__cxx11::string::~string(local_1b8);
      }
      if ((bool)uVar8 == false) {
        pvVar5 = (void *)std::ostream::operator<<(&std::cout,-1);
        std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
      }
      else {
        auVar7 = (**(code **)(**(long **)(in_RDI + 0x10) + 8))();
        local_1d8 = auVar7._8_8_;
        this_00 = auVar7._0_8_;
        *(undefined8 *)(this_00 + 0x78) = local_1d8;
        local_1e8 = this_00;
        local_1e0 = this_00;
        pcVar3 = (char *)std::__cxx11::string::c_str();
        strcpy((char *)this_00,pcVar3);
        pSVar4 = local_1e8 + 0x15;
        pcVar3 = (char *)std::__cxx11::string::c_str();
        strcpy((char *)pSVar4,pcVar3);
        pSVar4 = local_1e8 + 0x34;
        pcVar3 = (char *)std::__cxx11::string::c_str();
        strcpy((char *)pSVar4,pcVar3);
        pSVar4 = local_1e8 + 0x49;
        pcVar3 = (char *)std::__cxx11::string::c_str();
        strcpy((char *)pSVar4,pcVar3);
        *(int *)(local_1e8 + 0x68) = local_12c;
        *(undefined4 *)(local_1e8 + 0x6c) = 0;
        (**(code **)(**(long **)(in_RDI + 0x10) + 0x18))(*(long **)(in_RDI + 0x10),local_1e8 + 0x78)
        ;
        pSVar4 = local_1e8;
        str = &local_221;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_220,(char *)pSVar4,str);
        local_200 = StringHasher::operator()(this_00,(string *)str);
        std::pair<const_unsigned_long_long,_long>::pair<unsigned_long_long,_long_&,_true>
                  (&local_1f8,&local_200,(long *)(local_1e8 + 0x78));
        BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::insert
                  (in_stack_000003d8,in_stack_000003d0);
        std::__cxx11::string::~string(local_220);
        std::allocator<char>::~allocator((allocator<char> *)&local_221);
        pvVar5 = (void *)std::ostream::operator<<(&std::cout,0);
        std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
      }
    }
    std::__cxx11::string::~string(local_128);
    std::__cxx11::string::~string(local_108);
    std::__cxx11::string::~string(local_e8);
    std::__cxx11::string::~string(local_c8);
    std::__cxx11::string::~string(local_a8);
  }
  return;
}

Assistant:

void add_user(int argc, std::string *argv) {
            if (UserBpTree->empty()) {
                auto ret = UserFile->newspace();
                userType *user = ret.first;
                user->offset = ret.second;
                user->privilege = 10;
                for (int i = 0; i < argc; i += 2) {
                    if (argv[i] == "-u") strcpy(user->username, argv[i + 1].c_str());
                    else if (argv[i] == "-p") strcpy(user->password, argv[i + 1].c_str());
                    else if (argv[i] == "-n") strcpy(user->name, argv[i + 1].c_str());
                    else if (argv[i] == "-m") strcpy(user->mailAddr, argv[i + 1].c_str());
                }
                user->is_online = 0;
                UserFile->save(user->offset);
                UserBpTree->insert(BplusTree<StringHasher::hashType , locType>::value_type(hasher(user->username), user->offset));
                std::cout << 0 << std::endl;
            } else {
                std::string usname, uspass, uname, umail, current;
                int upri;
                for (int i = 0; i < argc; i += 2) {
                    if (argv[i] == "-u") usname = argv[i + 1];
                    else if (argv[i] == "-p") uspass = argv[i + 1];
                    else if (argv[i] == "-n") uname = argv[i + 1];
                    else if (argv[i] == "-m") umail = argv[i + 1];
                    else if (argv[i] == "-c") current = argv[i + 1];
                    else if (argv[i] == "-g") upri = stoi(argv[i + 1]);
                }
                std::pair<locType, bool> tmp = UserBpTree->find(hasher(current));
                if (tmp.second)
		{
			userType *curuser = UserFile->read(tmp.first);
			if (curuser -> is_online == online_flag && curuser->privilege > upri && UserBpTree -> find(hasher(usname)).second == false)
			{
				auto ret = UserFile -> newspace();
				userType *user = ret . first;
				user -> offset = ret . second;
				strcpy(user -> username , usname . c_str());
				strcpy(user -> password , uspass . c_str());
				strcpy(user -> name , uname . c_str());
				strcpy(user -> mailAddr , umail . c_str());
				user -> privilege = upri;
				user -> is_online = 0;
				UserFile -> save(user -> offset);
				UserBpTree -> insert(BplusTree<StringHasher::hashType , locType>::value_type(
					hasher(user -> username) , user -> offset));
				std::cout << 0 << std::endl;
			}else std::cout << -1 << std::endl;
                } else std::cout << -1 << std::endl;
            }
        }